

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url.c
# Opt level: O0

int nng_url_clone(nng_url **dstp,nng_url *src)

{
  int iVar1;
  nng_url *dst_00;
  int rv;
  nng_url *dst;
  nng_url *src_local;
  nng_url **dstp_local;
  
  dst_00 = (nng_url *)nni_zalloc(200);
  if (dst_00 == (nng_url *)0x0) {
    dstp_local._4_4_ = 2;
  }
  else {
    iVar1 = nni_url_clone_inline(dst_00,src);
    dstp_local._4_4_ = (uint)(iVar1 != 0);
    if (iVar1 != 0) {
      nni_free(dst_00,200);
    }
    else {
      *dstp = dst_00;
      dstp_local._4_4_ = 0;
    }
  }
  return dstp_local._4_4_;
}

Assistant:

int
nng_url_clone(nng_url **dstp, const nng_url *src)
{
	nng_url *dst;
	int      rv;
	if ((dst = NNI_ALLOC_STRUCT(dst)) == NULL) {
		return (NNG_ENOMEM);
	}
	if ((rv = nni_url_clone_inline(dst, src) != 0)) {
		NNI_FREE_STRUCT(dst);
		return (rv);
	}
	*dstp = dst;
	return (0);
}